

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O0

void nn_connect_socket(nn_options_t *options,int sock)

{
  int iVar1;
  int local_18;
  int rc;
  int i;
  int sock_local;
  nn_options_t *options_local;
  
  for (local_18 = 0; local_18 < (options->bind_addresses).num; local_18 = local_18 + 1) {
    iVar1 = nn_bind(sock,(options->bind_addresses).items[local_18]);
    nn_assert_errno((uint)(-1 < iVar1),"Can\'t bind");
  }
  for (local_18 = 0; local_18 < (options->connect_addresses).num; local_18 = local_18 + 1) {
    iVar1 = nn_connect(sock,(options->connect_addresses).items[local_18]);
    nn_assert_errno((uint)(-1 < iVar1),"Can\'t connect");
  }
  return;
}

Assistant:

void nn_connect_socket (nn_options_t *options, int sock)
{
    int i;
    int rc;

    for (i = 0; i < options->bind_addresses.num; ++i) {
        rc = nn_bind (sock, options->bind_addresses.items[i]);
        nn_assert_errno (rc >= 0, "Can't bind");
    }
    for (i = 0; i < options->connect_addresses.num; ++i) {
        rc = nn_connect (sock, options->connect_addresses.items[i]);
        nn_assert_errno (rc >= 0, "Can't connect");
    }
}